

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O2

void __thiscall cmCTestUploadCommand::~cmCTestUploadCommand(cmCTestUploadCommand *this)

{
  ~cmCTestUploadCommand(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

cmCTestUploadCommand() {}